

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

void StoreCommands(MemoryManager *m,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  uint8_t uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint8_t cmd_depths [128];
  uint16_t local_1178 [4];
  uint16_t auStack_1170 [4];
  uint16_t local_1168 [4];
  uint16_t auStack_1160 [4];
  uint16_t local_1158 [4];
  uint16_t auStack_1150 [4];
  uint16_t local_1148 [4];
  uint16_t auStack_1140 [4];
  uint16_t local_1138 [4];
  uint16_t auStack_1130 [4];
  uint16_t local_1128 [4];
  uint16_t auStack_1120 [4];
  uint16_t local_1118 [4];
  uint16_t auStack_1110 [4];
  uint16_t local_1108 [4];
  uint16_t auStack_1100 [4];
  uint16_t local_10f8 [64];
  uint32_t local_1078;
  undefined8 local_1074;
  uint32_t local_f78 [20];
  int local_f28;
  uint8_t local_e78 [8];
  uint8_t auStack_e70 [56];
  undefined8 local_e38 [8];
  uint8_t local_df8 [64];
  uint8_t local_db8 [64];
  uint8_t auStack_d78 [128];
  uint8_t local_cf8 [64];
  uint8_t auStack_cb8 [256];
  uint8_t lit_depths [256];
  uint16_t cmd_bits [64];
  uint16_t lit_bits [256];
  uint32_t lit_histo [256];
  HuffmanTree tree [129];
  
  memset(lit_histo,0,0x400);
  cmd_depths[0x70] = '\0';
  cmd_depths[0x71] = '\0';
  cmd_depths[0x72] = '\0';
  cmd_depths[0x73] = '\0';
  cmd_depths[0x74] = '\0';
  cmd_depths[0x75] = '\0';
  cmd_depths[0x76] = '\0';
  cmd_depths[0x77] = '\0';
  cmd_depths[0x78] = '\0';
  cmd_depths[0x79] = '\0';
  cmd_depths[0x7a] = '\0';
  cmd_depths[0x7b] = '\0';
  cmd_depths[0x7c] = '\0';
  cmd_depths[0x7d] = '\0';
  cmd_depths[0x7e] = '\0';
  cmd_depths[0x7f] = '\0';
  cmd_depths[0x60] = '\0';
  cmd_depths[0x61] = '\0';
  cmd_depths[0x62] = '\0';
  cmd_depths[99] = '\0';
  cmd_depths[100] = '\0';
  cmd_depths[0x65] = '\0';
  cmd_depths[0x66] = '\0';
  cmd_depths[0x67] = '\0';
  cmd_depths[0x68] = '\0';
  cmd_depths[0x69] = '\0';
  cmd_depths[0x6a] = '\0';
  cmd_depths[0x6b] = '\0';
  cmd_depths[0x6c] = '\0';
  cmd_depths[0x6d] = '\0';
  cmd_depths[0x6e] = '\0';
  cmd_depths[0x6f] = '\0';
  cmd_depths[0x50] = '\0';
  cmd_depths[0x51] = '\0';
  cmd_depths[0x52] = '\0';
  cmd_depths[0x53] = '\0';
  cmd_depths[0x54] = '\0';
  cmd_depths[0x55] = '\0';
  cmd_depths[0x56] = '\0';
  cmd_depths[0x57] = '\0';
  cmd_depths[0x58] = '\0';
  cmd_depths[0x59] = '\0';
  cmd_depths[0x5a] = '\0';
  cmd_depths[0x5b] = '\0';
  cmd_depths[0x5c] = '\0';
  cmd_depths[0x5d] = '\0';
  cmd_depths[0x5e] = '\0';
  cmd_depths[0x5f] = '\0';
  cmd_depths[0x40] = '\0';
  cmd_depths[0x41] = '\0';
  cmd_depths[0x42] = '\0';
  cmd_depths[0x43] = '\0';
  cmd_depths[0x44] = '\0';
  cmd_depths[0x45] = '\0';
  cmd_depths[0x46] = '\0';
  cmd_depths[0x47] = '\0';
  cmd_depths[0x48] = '\0';
  cmd_depths[0x49] = '\0';
  cmd_depths[0x4a] = '\0';
  cmd_depths[0x4b] = '\0';
  cmd_depths[0x4c] = '\0';
  cmd_depths[0x4d] = '\0';
  cmd_depths[0x4e] = '\0';
  cmd_depths[0x4f] = '\0';
  cmd_depths[0x30] = '\0';
  cmd_depths[0x31] = '\0';
  cmd_depths[0x32] = '\0';
  cmd_depths[0x33] = '\0';
  cmd_depths[0x34] = '\0';
  cmd_depths[0x35] = '\0';
  cmd_depths[0x36] = '\0';
  cmd_depths[0x37] = '\0';
  cmd_depths[0x38] = '\0';
  cmd_depths[0x39] = '\0';
  cmd_depths[0x3a] = '\0';
  cmd_depths[0x3b] = '\0';
  cmd_depths[0x3c] = '\0';
  cmd_depths[0x3d] = '\0';
  cmd_depths[0x3e] = '\0';
  cmd_depths[0x3f] = '\0';
  cmd_depths[0x20] = '\0';
  cmd_depths[0x21] = '\0';
  cmd_depths[0x22] = '\0';
  cmd_depths[0x23] = '\0';
  cmd_depths[0x24] = '\0';
  cmd_depths[0x25] = '\0';
  cmd_depths[0x26] = '\0';
  cmd_depths[0x27] = '\0';
  cmd_depths[0x28] = '\0';
  cmd_depths[0x29] = '\0';
  cmd_depths[0x2a] = '\0';
  cmd_depths[0x2b] = '\0';
  cmd_depths[0x2c] = '\0';
  cmd_depths[0x2d] = '\0';
  cmd_depths[0x2e] = '\0';
  cmd_depths[0x2f] = '\0';
  cmd_depths[0x10] = '\0';
  cmd_depths[0x11] = '\0';
  cmd_depths[0x12] = '\0';
  cmd_depths[0x13] = '\0';
  cmd_depths[0x14] = '\0';
  cmd_depths[0x15] = '\0';
  cmd_depths[0x16] = '\0';
  cmd_depths[0x17] = '\0';
  cmd_depths[0x18] = '\0';
  cmd_depths[0x19] = '\0';
  cmd_depths[0x1a] = '\0';
  cmd_depths[0x1b] = '\0';
  cmd_depths[0x1c] = '\0';
  cmd_depths[0x1d] = '\0';
  cmd_depths[0x1e] = '\0';
  cmd_depths[0x1f] = '\0';
  cmd_depths[0] = '\0';
  cmd_depths[1] = '\0';
  cmd_depths[2] = '\0';
  cmd_depths[3] = '\0';
  cmd_depths[4] = '\0';
  cmd_depths[5] = '\0';
  cmd_depths[6] = '\0';
  cmd_depths[7] = '\0';
  cmd_depths[8] = '\0';
  cmd_depths[9] = '\0';
  cmd_depths[10] = '\0';
  cmd_depths[0xb] = '\0';
  cmd_depths[0xc] = '\0';
  cmd_depths[0xd] = '\0';
  cmd_depths[0xe] = '\0';
  cmd_depths[0xf] = '\0';
  local_10f8[0x38] = 0;
  local_10f8[0x39] = 0;
  local_10f8[0x3a] = 0;
  local_10f8[0x3b] = 0;
  local_10f8[0x3c] = 0;
  local_10f8[0x3d] = 0;
  local_10f8[0x3e] = 0;
  local_10f8[0x3f] = 0;
  local_10f8[0x30] = 0;
  local_10f8[0x31] = 0;
  local_10f8[0x32] = 0;
  local_10f8[0x33] = 0;
  local_10f8[0x34] = 0;
  local_10f8[0x35] = 0;
  local_10f8[0x36] = 0;
  local_10f8[0x37] = 0;
  local_10f8[0x28] = 0;
  local_10f8[0x29] = 0;
  local_10f8[0x2a] = 0;
  local_10f8[0x2b] = 0;
  local_10f8[0x2c] = 0;
  local_10f8[0x2d] = 0;
  local_10f8[0x2e] = 0;
  local_10f8[0x2f] = 0;
  local_10f8[0x20] = 0;
  local_10f8[0x21] = 0;
  local_10f8[0x22] = 0;
  local_10f8[0x23] = 0;
  local_10f8[0x24] = 0;
  local_10f8[0x25] = 0;
  local_10f8[0x26] = 0;
  local_10f8[0x27] = 0;
  local_10f8[0x18] = 0;
  local_10f8[0x19] = 0;
  local_10f8[0x1a] = 0;
  local_10f8[0x1b] = 0;
  local_10f8[0x1c] = 0;
  local_10f8[0x1d] = 0;
  local_10f8[0x1e] = 0;
  local_10f8[0x1f] = 0;
  local_10f8[0x10] = 0;
  local_10f8[0x11] = 0;
  local_10f8[0x12] = 0;
  local_10f8[0x13] = 0;
  local_10f8[0x14] = 0;
  local_10f8[0x15] = 0;
  local_10f8[0x16] = 0;
  local_10f8[0x17] = 0;
  local_10f8[8] = 0;
  local_10f8[9] = 0;
  local_10f8[10] = 0;
  local_10f8[0xb] = 0;
  local_10f8[0xc] = 0;
  local_10f8[0xd] = 0;
  local_10f8[0xe] = 0;
  local_10f8[0xf] = 0;
  local_10f8[0] = 0;
  local_10f8[1] = 0;
  local_10f8[2] = 0;
  local_10f8[3] = 0;
  local_10f8[4] = 0;
  local_10f8[5] = 0;
  local_10f8[6] = 0;
  local_10f8[7] = 0;
  memset(&local_1078,0,0x200);
  if (num_literals != 0) {
    sVar3 = 0;
    do {
      lit_histo[literals[sVar3]] = lit_histo[literals[sVar3]] + 1;
      sVar3 = sVar3 + 1;
    } while (num_literals != sVar3);
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,lit_histo,num_literals,8,lit_depths,lit_bits,storage_ix,storage);
  if (num_commands == 0) {
    local_1074 = 0x100000001;
    local_f28 = 1;
    local_f78[0] = 1;
  }
  else {
    sVar3 = 0;
    do {
      (&local_1078)[(byte)commands[sVar3]] = (&local_1078)[(byte)commands[sVar3]] + 1;
      sVar3 = sVar3 + 1;
    } while (num_commands != sVar3);
    local_1074 = CONCAT44((int)((ulong)local_1074 >> 0x20) + 1,(int)local_1074 + 1);
    local_f78[0] = local_f78[0] + 1;
    local_f28 = local_f28 + 1;
  }
  lVar9 = 0;
  memset(local_e38,0,0x280);
  BrotliCreateHuffmanTree(&local_1078,0x40,0xf,tree,cmd_depths);
  BrotliCreateHuffmanTree(local_f78,0x40,0xe,tree,cmd_depths + 0x40);
  auStack_e70[8] = cmd_depths[0x28];
  auStack_e70[9] = cmd_depths[0x29];
  auStack_e70[10] = cmd_depths[0x2a];
  auStack_e70[0xb] = cmd_depths[0x2b];
  auStack_e70[0xc] = cmd_depths[0x2c];
  auStack_e70[0xd] = cmd_depths[0x2d];
  auStack_e70[0xe] = cmd_depths[0x2e];
  auStack_e70[0xf] = cmd_depths[0x2f];
  local_e78[0] = cmd_depths[0x18];
  local_e78[1] = cmd_depths[0x19];
  local_e78[2] = cmd_depths[0x1a];
  local_e78[3] = cmd_depths[0x1b];
  local_e78[4] = cmd_depths[0x1c];
  local_e78[5] = cmd_depths[0x1d];
  local_e78[6] = cmd_depths[0x1e];
  local_e78[7] = cmd_depths[0x1f];
  auStack_e70[0] = cmd_depths[0x20];
  auStack_e70[1] = cmd_depths[0x21];
  auStack_e70[2] = cmd_depths[0x22];
  auStack_e70[3] = cmd_depths[0x23];
  auStack_e70[4] = cmd_depths[0x24];
  auStack_e70[5] = cmd_depths[0x25];
  auStack_e70[6] = cmd_depths[0x26];
  auStack_e70[7] = cmd_depths[0x27];
  auStack_e70[0x10] = cmd_depths[0];
  auStack_e70[0x11] = cmd_depths[1];
  auStack_e70[0x12] = cmd_depths[2];
  auStack_e70[0x13] = cmd_depths[3];
  auStack_e70[0x14] = cmd_depths[4];
  auStack_e70[0x15] = cmd_depths[5];
  auStack_e70[0x16] = cmd_depths[6];
  auStack_e70[0x17] = cmd_depths[7];
  auStack_e70[0x18] = cmd_depths[0x30];
  auStack_e70[0x19] = cmd_depths[0x31];
  auStack_e70[0x1a] = cmd_depths[0x32];
  auStack_e70[0x1b] = cmd_depths[0x33];
  auStack_e70[0x1c] = cmd_depths[0x34];
  auStack_e70[0x1d] = cmd_depths[0x35];
  auStack_e70[0x1e] = cmd_depths[0x36];
  auStack_e70[0x1f] = cmd_depths[0x37];
  auStack_e70[0x20] = cmd_depths[8];
  auStack_e70[0x21] = cmd_depths[9];
  auStack_e70[0x22] = cmd_depths[10];
  auStack_e70[0x23] = cmd_depths[0xb];
  auStack_e70[0x24] = cmd_depths[0xc];
  auStack_e70[0x25] = cmd_depths[0xd];
  auStack_e70[0x26] = cmd_depths[0xe];
  auStack_e70[0x27] = cmd_depths[0xf];
  auStack_e70[0x28] = cmd_depths[0x38];
  auStack_e70[0x29] = cmd_depths[0x39];
  auStack_e70[0x2a] = cmd_depths[0x3a];
  auStack_e70[0x2b] = cmd_depths[0x3b];
  auStack_e70[0x2c] = cmd_depths[0x3c];
  auStack_e70[0x2d] = cmd_depths[0x3d];
  auStack_e70[0x2e] = cmd_depths[0x3e];
  auStack_e70[0x2f] = cmd_depths[0x3f];
  auStack_e70[0x30] = cmd_depths[0x10];
  auStack_e70[0x31] = cmd_depths[0x11];
  auStack_e70[0x32] = cmd_depths[0x12];
  auStack_e70[0x33] = cmd_depths[0x13];
  auStack_e70[0x34] = cmd_depths[0x14];
  auStack_e70[0x35] = cmd_depths[0x15];
  auStack_e70[0x36] = cmd_depths[0x16];
  auStack_e70[0x37] = cmd_depths[0x17];
  BrotliConvertBitDepthsToSymbols(local_e78,0x40,cmd_bits);
  local_1178[0] = cmd_bits[0x18];
  local_1178[1] = cmd_bits[0x19];
  local_1178[2] = cmd_bits[0x1a];
  local_1178[3] = cmd_bits[0x1b];
  auStack_1170[0] = cmd_bits[0x1c];
  auStack_1170[1] = cmd_bits[0x1d];
  auStack_1170[2] = cmd_bits[0x1e];
  auStack_1170[3] = cmd_bits[0x1f];
  local_1168[0] = cmd_bits[0x28];
  local_1168[1] = cmd_bits[0x29];
  local_1168[2] = cmd_bits[0x2a];
  local_1168[3] = cmd_bits[0x2b];
  auStack_1160[0] = cmd_bits[0x2c];
  auStack_1160[1] = cmd_bits[0x2d];
  auStack_1160[2] = cmd_bits[0x2e];
  auStack_1160[3] = cmd_bits[0x2f];
  local_1158[0] = cmd_bits[0x38];
  local_1158[1] = cmd_bits[0x39];
  local_1158[2] = cmd_bits[0x3a];
  local_1158[3] = cmd_bits[0x3b];
  auStack_1150[0] = cmd_bits[0x3c];
  auStack_1150[1] = cmd_bits[0x3d];
  auStack_1150[2] = cmd_bits[0x3e];
  auStack_1150[3] = cmd_bits[0x3f];
  local_1148[0] = cmd_bits[0];
  local_1148[1] = cmd_bits[1];
  local_1148[2] = cmd_bits[2];
  local_1148[3] = cmd_bits[3];
  auStack_1140[0] = cmd_bits[4];
  auStack_1140[1] = cmd_bits[5];
  auStack_1140[2] = cmd_bits[6];
  auStack_1140[3] = cmd_bits[7];
  local_1138[0] = cmd_bits[8];
  local_1138[1] = cmd_bits[9];
  local_1138[2] = cmd_bits[10];
  local_1138[3] = cmd_bits[0xb];
  auStack_1130[0] = cmd_bits[0xc];
  auStack_1130[1] = cmd_bits[0xd];
  auStack_1130[2] = cmd_bits[0xe];
  auStack_1130[3] = cmd_bits[0xf];
  local_1128[0] = cmd_bits[0x10];
  local_1128[1] = cmd_bits[0x11];
  local_1128[2] = cmd_bits[0x12];
  local_1128[3] = cmd_bits[0x13];
  auStack_1120[0] = cmd_bits[0x14];
  auStack_1120[1] = cmd_bits[0x15];
  auStack_1120[2] = cmd_bits[0x16];
  auStack_1120[3] = cmd_bits[0x17];
  local_1118[0] = cmd_bits[0x20];
  local_1118[1] = cmd_bits[0x21];
  local_1118[2] = cmd_bits[0x22];
  local_1118[3] = cmd_bits[0x23];
  auStack_1110[0] = cmd_bits[0x24];
  auStack_1110[1] = cmd_bits[0x25];
  auStack_1110[2] = cmd_bits[0x26];
  auStack_1110[3] = cmd_bits[0x27];
  local_1108[0] = cmd_bits[0x30];
  local_1108[1] = cmd_bits[0x31];
  local_1108[2] = cmd_bits[0x32];
  local_1108[3] = cmd_bits[0x33];
  auStack_1100[0] = cmd_bits[0x34];
  auStack_1100[1] = cmd_bits[0x35];
  auStack_1100[2] = cmd_bits[0x36];
  auStack_1100[3] = cmd_bits[0x37];
  BrotliConvertBitDepthsToSymbols(cmd_depths + 0x40,0x40,local_10f8);
  auStack_e70[0] = '\0';
  auStack_e70[1] = '\0';
  auStack_e70[2] = '\0';
  auStack_e70[3] = '\0';
  auStack_e70[4] = '\0';
  auStack_e70[5] = '\0';
  auStack_e70[6] = '\0';
  auStack_e70[7] = '\0';
  auStack_e70[0x28] = '\0';
  auStack_e70[0x29] = '\0';
  auStack_e70[0x2a] = '\0';
  auStack_e70[0x2b] = '\0';
  auStack_e70[0x2c] = '\0';
  auStack_e70[0x2d] = '\0';
  auStack_e70[0x2e] = '\0';
  auStack_e70[0x2f] = '\0';
  auStack_e70[0x30] = '\0';
  auStack_e70[0x31] = '\0';
  auStack_e70[0x32] = '\0';
  auStack_e70[0x33] = '\0';
  auStack_e70[0x34] = '\0';
  auStack_e70[0x35] = '\0';
  auStack_e70[0x36] = '\0';
  auStack_e70[0x37] = '\0';
  auStack_e70[0x18] = '\0';
  auStack_e70[0x19] = '\0';
  auStack_e70[0x1a] = '\0';
  auStack_e70[0x1b] = '\0';
  auStack_e70[0x1c] = '\0';
  auStack_e70[0x1d] = '\0';
  auStack_e70[0x1e] = '\0';
  auStack_e70[0x1f] = '\0';
  auStack_e70[0x20] = '\0';
  auStack_e70[0x21] = '\0';
  auStack_e70[0x22] = '\0';
  auStack_e70[0x23] = '\0';
  auStack_e70[0x24] = '\0';
  auStack_e70[0x25] = '\0';
  auStack_e70[0x26] = '\0';
  auStack_e70[0x27] = '\0';
  auStack_e70[8] = '\0';
  auStack_e70[9] = '\0';
  auStack_e70[10] = '\0';
  auStack_e70[0xb] = '\0';
  auStack_e70[0xc] = '\0';
  auStack_e70[0xd] = '\0';
  auStack_e70[0xe] = '\0';
  auStack_e70[0xf] = '\0';
  auStack_e70[0x10] = '\0';
  auStack_e70[0x11] = '\0';
  auStack_e70[0x12] = '\0';
  auStack_e70[0x13] = '\0';
  auStack_e70[0x14] = '\0';
  auStack_e70[0x15] = '\0';
  auStack_e70[0x16] = '\0';
  auStack_e70[0x17] = '\0';
  local_e78[0] = cmd_depths[0x18];
  local_e78[1] = cmd_depths[0x19];
  local_e78[2] = cmd_depths[0x1a];
  local_e78[3] = cmd_depths[0x1b];
  local_e78[4] = cmd_depths[0x1c];
  local_e78[5] = cmd_depths[0x1d];
  local_e78[6] = cmd_depths[0x1e];
  local_e78[7] = cmd_depths[0x1f];
  local_e38[0]._0_1_ = cmd_depths[0x20];
  local_e38[0]._1_1_ = cmd_depths[0x21];
  local_e38[0]._2_1_ = cmd_depths[0x22];
  local_e38[0]._3_1_ = cmd_depths[0x23];
  local_e38[0]._4_1_ = cmd_depths[0x24];
  local_e38[0]._5_1_ = cmd_depths[0x25];
  local_e38[0]._6_1_ = cmd_depths[0x26];
  local_e38[0]._7_1_ = cmd_depths[0x27];
  local_df8[0] = cmd_depths[0x28];
  local_df8[1] = cmd_depths[0x29];
  local_df8[2] = cmd_depths[0x2a];
  local_df8[3] = cmd_depths[0x2b];
  local_df8[4] = cmd_depths[0x2c];
  local_df8[5] = cmd_depths[0x2d];
  local_df8[6] = cmd_depths[0x2e];
  local_df8[7] = cmd_depths[0x2f];
  local_db8[0] = cmd_depths[0x30];
  local_db8[1] = cmd_depths[0x31];
  local_db8[2] = cmd_depths[0x32];
  local_db8[3] = cmd_depths[0x33];
  local_db8[4] = cmd_depths[0x34];
  local_db8[5] = cmd_depths[0x35];
  local_db8[6] = cmd_depths[0x36];
  local_db8[7] = cmd_depths[0x37];
  local_cf8[0] = cmd_depths[0x38];
  local_cf8[1] = cmd_depths[0x39];
  local_cf8[2] = cmd_depths[0x3a];
  local_cf8[3] = cmd_depths[0x3b];
  local_cf8[4] = cmd_depths[0x3c];
  local_cf8[5] = cmd_depths[0x3d];
  local_cf8[6] = cmd_depths[0x3e];
  local_cf8[7] = cmd_depths[0x3f];
  do {
    uVar1 = cmd_depths[lVar9 + 8];
    local_df8[lVar9 * 8] = cmd_depths[lVar9];
    auStack_d78[lVar9 * 8] = uVar1;
    auStack_cb8[lVar9 * 8] = cmd_depths[lVar9 + 0x10];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  BrotliStoreHuffmanTree(local_e78,0x2c0,tree,storage_ix,storage);
  BrotliStoreHuffmanTree(cmd_depths + 0x40,0x40,tree,storage_ix,storage);
  if (num_commands != 0) {
    uVar4 = *storage_ix;
    sVar3 = 0;
    do {
      uVar7 = commands[sVar3] & 0xff;
      uVar5 = commands[sVar3] >> 8;
      uVar8 = cmd_depths[uVar7] + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)local_1178[uVar7] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar8;
      uVar4 = StoreCommands::kNumExtraBits[uVar7] + uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)uVar5 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      *storage_ix = uVar4;
      if (uVar7 < 0x18) {
        for (iVar6 = uVar5 + StoreCommands::kInsertOffset[uVar7]; iVar6 != 0; iVar6 = iVar6 + -1) {
          bVar2 = lit_depths[*literals];
          *(ulong *)(storage + (uVar4 >> 3)) =
               (ulong)lit_bits[*literals] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
          uVar4 = uVar4 + bVar2;
          *storage_ix = uVar4;
          literals = literals + 1;
        }
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != num_commands);
  }
  return;
}

Assistant:

static void StoreCommands(MemoryManager* m,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  uint8_t lit_depths[256];
  uint16_t lit_bits[256];
  uint32_t lit_histo[256] = { 0 };
  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  size_t i;
  for (i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo, num_literals,
                                     /* max_bits = */ 8,
                                     lit_depths, lit_bits,
                                     storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++cmd_histo[code];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}